

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O0

void __thiscall fizplex::Simplex::solve(Simplex *this)

{
  Candidate candidate_00;
  RatioTestResult rt_00;
  Candidate candidate_01;
  Candidate candidate_02;
  RatioTestResult rt_01;
  long in_RDI;
  RatioTestResult rt;
  IterationDecision iteration_decision;
  Candidate candidate;
  Base base;
  int round;
  LP *in_stack_fffffffffffffe48;
  Simplex *this_00;
  Base *id;
  Simplex *in_stack_fffffffffffffe60;
  DVector *in_stack_fffffffffffffe78;
  Simplex *in_stack_fffffffffffffe80;
  Simplex *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffe90;
  Base *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  IterationDecision in_stack_fffffffffffffea4;
  double dVar1;
  undefined1 *puVar2;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int iVar3;
  Simplex *in_stack_fffffffffffffed0;
  DVector *in_stack_fffffffffffffee0;
  LP *in_stack_fffffffffffffee8;
  Simplex *in_stack_fffffffffffffef0;
  Base *in_stack_fffffffffffffef8;
  Simplex *in_stack_ffffffffffffff00;
  LP *in_stack_ffffffffffffff28;
  Simplex *in_stack_ffffffffffffff30;
  IterationDecision local_a0;
  undefined4 uStack_9c;
  Simplex *pSStack_98;
  Simplex *local_90;
  DVector *pDStack_88;
  IterationDecision local_7c;
  byte local_78;
  undefined7 uStack_77;
  Simplex *pSStack_70;
  Base *local_68;
  undefined1 local_50 [68];
  int local_c;
  
  set_initial_x(in_stack_fffffffffffffe80);
  local_c = 0;
  do {
    if (4999 < local_c) {
      return;
    }
    puVar2 = local_50;
    Base::Base((Base *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffee0);
    set_basic_solution(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (*(int *)(in_RDI + 0x7c) == 0) {
      set_phase_one_objective
                ((Simplex *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    dVar1 = DVector::operator*((DVector *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    *(double *)(in_RDI + 0x70) = dVar1;
    run_price(in_stack_ffffffffffffff30,(Base *)in_stack_ffffffffffffff28);
    local_7c = Unfinished;
    if ((local_78 & 1) != 0) {
      in_stack_fffffffffffffea4 = decision_for_optimality((Simplex *)in_stack_fffffffffffffe48);
      local_7c = in_stack_fffffffffffffea4;
    }
    in_stack_fffffffffffffe48 = (LP *)CONCAT71(uStack_77,local_78);
    candidate_01.index = in_RDI;
    candidate_01._0_8_ = puVar2;
    candidate_01.cost._0_4_ = in_stack_fffffffffffffec0;
    candidate_01.cost._4_4_ = in_stack_fffffffffffffec4;
    this_00 = pSStack_70;
    id = local_68;
    run_ratio_test((Simplex *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   candidate_01,in_stack_fffffffffffffe98);
    if (local_7c == Unfinished) {
      local_7c = local_a0;
    }
    if (0 < *(int *)(in_RDI + 8)) {
      print_iteration_results
                (in_stack_fffffffffffffe60,(IterationDecision *)id,(int)((ulong)this_00 >> 0x20));
    }
    in_stack_fffffffffffffe98 = (Base *)CONCAT44(0,local_7c);
    switch(in_stack_fffffffffffffe98) {
    case (Base *)0x0:
      in_stack_fffffffffffffe48 = (LP *)CONCAT71(uStack_77,local_78);
      in_stack_fffffffffffffe60 = (Simplex *)CONCAT44(uStack_9c,local_a0);
      candidate_00.index = (size_t)in_stack_fffffffffffffe88;
      candidate_00._0_8_ = in_stack_fffffffffffffe80;
      candidate_00.cost = (double)in_stack_fffffffffffffe90;
      rt_00.leaving_index._0_4_ = in_stack_fffffffffffffea0;
      rt_00._0_8_ = in_stack_fffffffffffffe98;
      rt_00.leaving_index._4_4_ = in_stack_fffffffffffffea4;
      rt_00.step_length = dVar1;
      rt_00.leaving_bound = (double)puVar2;
      this_00 = pSStack_70;
      in_stack_fffffffffffffe78 = pDStack_88;
      in_stack_fffffffffffffed0 = pSStack_98;
      in_stack_fffffffffffffee0 = pDStack_88;
      in_stack_fffffffffffffee8 = in_stack_fffffffffffffe48;
      in_stack_fffffffffffffef0 = pSStack_70;
      in_stack_fffffffffffffef8 = local_68;
      set_result_for_unbounded(local_90,candidate_00,rt_00);
      iVar3 = 1;
      break;
    case (Base *)0x1:
      in_stack_fffffffffffffe88 = local_90;
      in_stack_fffffffffffffe90 =
           DVector::operator[]((DVector *)in_stack_fffffffffffffe60,(size_t)id);
      *in_stack_fffffffffffffe90 = (double)in_stack_fffffffffffffe88 + *in_stack_fffffffffffffe90;
      goto LAB_001eab3a;
    case (Base *)0x2:
      in_stack_fffffffffffffe48 = (LP *)CONCAT71(uStack_77,local_78);
      in_stack_fffffffffffffe60 = (Simplex *)CONCAT44(uStack_9c,local_a0);
      candidate_02.index = (size_t)in_stack_fffffffffffffee8;
      candidate_02._0_8_ = in_stack_fffffffffffffee0;
      candidate_02.cost = (double)in_stack_fffffffffffffef0;
      rt_01.leaving_index = (size_t)in_stack_ffffffffffffff00;
      rt_01._0_8_ = in_stack_fffffffffffffef8;
      rt_01.step_length = (double)in_stack_fffffffffffffe60;
      rt_01.leaving_bound = (double)pSStack_98;
      this_00 = pSStack_70;
      in_stack_fffffffffffffe78 = pDStack_88;
      in_stack_ffffffffffffff28 = in_stack_fffffffffffffe48;
      in_stack_ffffffffffffff30 = pSStack_70;
      exchange_base_column(in_stack_fffffffffffffed0,candidate_02,rt_01);
      goto LAB_001eab3a;
    case (Base *)0x3:
      *(undefined4 *)(in_RDI + 0x78) = 1;
      iVar3 = 1;
      break;
    case (Base *)0x4:
      *(undefined4 *)(in_RDI + 0x7c) = 1;
      DVector::operator=((DVector *)this_00,(DVector *)in_stack_fffffffffffffe48);
LAB_001eab3a:
      iVar3 = 0;
      break;
    case (Base *)0x5:
      *(undefined4 *)(in_RDI + 0x78) = 0;
      iVar3 = 1;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                    ,0x59,"void fizplex::Simplex::solve()");
    }
    Base::~Base((Base *)this_00);
    if (iVar3 != 0) {
      return;
    }
    local_c = local_c + 1;
    in_stack_fffffffffffffec4 = 0;
  } while( true );
}

Assistant:

void Simplex::solve() {
  set_initial_x();

  for (int round = 0; round < max_rounds; round++) {
    Base base(lp, basic_indices);
    set_basic_solution(base);

    if (phase == Simplex::Phase::One)
      set_phase_one_objective();
    z = c * x;

    const auto candidate = run_price(base);

    IterationDecision iteration_decision = IterationDecision::Unfinished;
    if (candidate.is_optimal)
      iteration_decision = decision_for_optimality();

    const auto rt = run_ratio_test(candidate, base);
    if (iteration_decision == IterationDecision::Unfinished)
      iteration_decision = rt.result;

    if (print_level > 0)
      print_iteration_results(iteration_decision, round);

    switch (iteration_decision) {
    case IterationDecision::BaseChange: {
      exchange_base_column(candidate, rt);
      break;
    }
    case IterationDecision::Unbounded:
      set_result_for_unbounded(candidate, rt);
      return;
    case IterationDecision::BoundFlip:
      x[candidate.index] += rt.step_length;
      break;
    case IterationDecision::OptimalSolution:
      result = Result::OptimalSolution;
      return;
    case IterationDecision::SwitchToPhaseTwo:
      phase = Simplex::Phase::Two;
      c = lp.c;
      break;
    case IterationDecision::Infeasible:
      result = Result::Infeasible;
      return;
    default:
      assert(false);
    }
  }
}